

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O3

BatchedChunkIteratorRange __thiscall
duckdb::BatchedDataCollection::BatchRange(BatchedDataCollection *this,idx_t begin_idx,idx_t end_idx)

{
  batch_iterator_t bVar1;
  batch_iterator_t bVar2;
  idx_t iVar3;
  BatchedChunkIteratorRange BVar4;
  
  bVar2._M_node = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar3 = 0xffffffffffffffff;
  if (end_idx <= (this->data)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    iVar3 = end_idx;
  }
  bVar1._M_node = bVar2._M_node;
  if ((long)begin_idx < 1) {
    if (begin_idx != 0) {
      do {
        bVar1._M_node = (_Base_ptr)::std::_Rb_tree_decrement(bVar1._M_node);
        begin_idx = begin_idx + 1;
      } while (begin_idx != 0);
    }
  }
  else {
    do {
      bVar1._M_node = (_Base_ptr)::std::_Rb_tree_increment(bVar1._M_node);
      begin_idx = begin_idx - 1;
    } while (begin_idx != 0);
  }
  if (iVar3 == 0xffffffffffffffff) {
    bVar2._M_node = &(this->data)._M_t._M_impl.super__Rb_tree_header._M_header;
  }
  else if ((long)iVar3 < 1) {
    for (; iVar3 != 0; iVar3 = iVar3 + 1) {
      bVar2._M_node = (_Base_ptr)::std::_Rb_tree_decrement(bVar2._M_node);
    }
  }
  else {
    do {
      bVar2._M_node = (_Base_ptr)::std::_Rb_tree_increment(bVar2._M_node);
      end_idx = end_idx - 1;
    } while (end_idx != 0);
  }
  BVar4.end._M_node = bVar2._M_node;
  BVar4.begin._M_node = bVar1._M_node;
  return BVar4;
}

Assistant:

BatchedChunkIteratorRange BatchedDataCollection::BatchRange(idx_t begin_idx, idx_t end_idx) {
	D_ASSERT(begin_idx < end_idx);
	if (end_idx > data.size()) {
		// Limit the iterator to the end
		end_idx = DConstants::INVALID_INDEX;
	}
	BatchedChunkIteratorRange range;
	range.begin = data.begin();
	std::advance(range.begin, begin_idx);
	if (end_idx == DConstants::INVALID_INDEX) {
		range.end = data.end();
	} else {
		range.end = data.begin();
		std::advance(range.end, end_idx);
	}
	return range;
}